

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O2

void __thiscall binlog::EventStream::readWriterProp(EventStream *this,Range range)

{
  WriterProp wp;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  uint64_t local_28;
  Range local_20;
  
  local_20._end = range._end;
  local_20._begin = range._begin;
  local_50 = (undefined1  [8])0x0;
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28 = 0;
  mserialize::
  StructDeserializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
  ::deserialize<binlog::Range>((WriterProp *)local_50,&local_20);
  WriterProp::operator=(&this->_writerProp,(WriterProp *)local_50);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void EventStream::readWriterProp(Range range)
{
  // Make sure _writerProp is updated only if deserialize does not throw
  WriterProp wp;
  mserialize::deserialize(wp, range);
  _writerProp = std::move(wp);
}